

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void * __thiscall
anon_unknown.dwarf_3537c6::BumpPointerAllocator::allocate(BumpPointerAllocator *this,size_t N)

{
  BlockMeta *pBVar1;
  BlockMeta *pBVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (int)N + 0xfU & 0xfffffff0;
  uVar5 = (ulong)uVar4;
  pBVar1 = this->BlockList;
  sVar3 = pBVar1->Current;
  pBVar2 = pBVar1;
  if (0xfef < sVar3 + uVar5) {
    if (0xff0 < uVar4) {
      pBVar2 = (BlockMeta *)malloc(uVar5 + 0x10);
      if (pBVar2 == (BlockMeta *)0x0) {
LAB_0018b777:
        std::terminate();
      }
      pBVar2->Next = pBVar1->Next;
      pBVar2->Current = 0;
      pBVar1->Next = pBVar2;
      goto LAB_0018b771;
    }
    pBVar2 = (BlockMeta *)malloc(0x1000);
    if (pBVar2 == (BlockMeta *)0x0) goto LAB_0018b777;
    pBVar2->Next = pBVar1;
    pBVar2->Current = 0;
    this->BlockList = pBVar2;
    sVar3 = 0;
  }
  pBVar2->Current = uVar5 + sVar3;
  pBVar2 = (BlockMeta *)((long)&pBVar2->Next + sVar3);
LAB_0018b771:
  return pBVar2 + 1;
}

Assistant:

void* allocate(size_t N) {
    N = (N + 15u) & ~15u;
    if (N + BlockList->Current >= UsableAllocSize) {
      if (N > UsableAllocSize)
        return allocateMassive(N);
      grow();
    }
    BlockList->Current += N;
    return static_cast<void*>(reinterpret_cast<char*>(BlockList + 1) +
                              BlockList->Current - N);
  }